

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Solver.cc
# Opt level: O2

void __thiscall
Glucose::Solver::minimisationWithBinaryResolution(Solver *this,vec<Glucose::Lit> *out_learnt)

{
  unsigned_long *puVar1;
  Lit *pLVar2;
  uint *puVar3;
  bool bVar4;
  uint uVar5;
  int iVar6;
  undefined8 in_RAX;
  int iVar7;
  int iVar8;
  int iVar9;
  long lVar10;
  vec<Glucose::Solver::Watcher> *pvVar11;
  int k;
  undefined8 uStack_38;
  
  uStack_38 = in_RAX;
  uVar5 = computeLBD<Glucose::vec<Glucose::Lit>>(this,out_learnt,-1);
  if (uVar5 <= this->lbLBDMinimizingClause) {
    pLVar2 = out_learnt->data;
    iVar8 = pLVar2->x;
    uVar5 = this->MYFLAG + 1;
    this->MYFLAG = uVar5;
    puVar3 = (this->permDiff).data;
    for (lVar10 = 1; lVar10 < out_learnt->sz; lVar10 = lVar10 + 1) {
      puVar3[pLVar2[lVar10].x >> 1] = uVar5;
    }
    pvVar11 = (this->watchesBin).occs.data + ((long)iVar8 ^ 1);
    iVar8 = 0;
    for (lVar10 = 0; lVar10 < pvVar11->sz; lVar10 = lVar10 + 1) {
      iVar6 = pvVar11->data[lVar10].blocker.x;
      iVar7 = iVar6 >> 1;
      if ((this->permDiff).data[iVar7] == this->MYFLAG) {
        uStack_38 = CONCAT17((byte)iVar6 & 1 ^ (this->assigns).data[iVar7].value,
                             (undefined7)uStack_38);
        bVar4 = lbool::operator==((lbool *)((long)&uStack_38 + 7),(lbool)0x0);
        if (bVar4) {
          iVar8 = iVar8 + 1;
          (this->permDiff).data[iVar7] = this->MYFLAG - 1;
        }
      }
    }
    if (0 < iVar8) {
      iVar7 = out_learnt->sz;
      puVar1 = (this->stats).data + 9;
      *puVar1 = *puVar1 + 1;
      iVar6 = iVar7 + -1;
      pLVar2 = out_learnt->data;
      puVar3 = (this->permDiff).data;
      for (iVar9 = 1; iVar9 < iVar7 - iVar8; iVar9 = iVar9 + 1) {
        if (puVar3[pLVar2[iVar9].x >> 1] != this->MYFLAG) {
          iVar7 = pLVar2[iVar6].x;
          pLVar2[iVar6].x = pLVar2[iVar9].x;
          pLVar2[iVar9].x = iVar7;
          iVar6 = iVar6 + -1;
          iVar9 = iVar9 + -1;
          iVar7 = out_learnt->sz;
        }
      }
      vec<Glucose::Lit>::shrink(out_learnt,iVar8);
    }
  }
  return;
}

Assistant:

void Solver::minimisationWithBinaryResolution(vec <Lit> &out_learnt) {

    // Find the LBD measure
    unsigned int lbd = computeLBD(out_learnt);
    Lit p = ~out_learnt[0];

    if(lbd <= lbLBDMinimizingClause) {
        MYFLAG++;

        for(int i = 1; i < out_learnt.size(); i++) {
            permDiff[var(out_learnt[i])] = MYFLAG;
        }

        vec <Watcher> &wbin = watchesBin[p];
        int nb = 0;
        for(int k = 0; k < wbin.size(); k++) {
            Lit imp = wbin[k].blocker;
            if(permDiff[var(imp)] == MYFLAG && value(imp) == l_True) {
                nb++;
                permDiff[var(imp)] = MYFLAG - 1;
            }
        }
        int l = out_learnt.size() - 1;
        if(nb > 0) {
            stats[nbReducedClauses]++;
            for(int i = 1; i < out_learnt.size() - nb; i++) {
                if(permDiff[var(out_learnt[i])] != MYFLAG) {
                    Lit p = out_learnt[l];
                    out_learnt[l] = out_learnt[i];
                    out_learnt[i] = p;
                    l--;
                    i--;
                }
            }

            out_learnt.shrink(nb);

        }
    }
}